

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

bool Path::touch(string *path)

{
  int __fd;
  int iVar1;
  char *__file;
  undefined1 auStack_48 [7];
  bool ret;
  timespec times [2];
  int fd;
  string *path_local;
  
  __file = (char *)std::__cxx11::string::c_str();
  __fd = open(__file,0x241,0x1a0);
  if (__fd < 0) {
    path_local._7_1_ = false;
  }
  else {
    _auStack_48 = 0;
    times[0].tv_sec = 0x3fffffff;
    times[0].tv_nsec = 0;
    times[1].tv_sec = 0x3fffffff;
    iVar1 = futimens(__fd,(timespec *)auStack_48);
    path_local._7_1_ = iVar1 == 0;
    close(__fd);
  }
  return path_local._7_1_;
}

Assistant:

bool touch(const std::string &path)
{
#ifdef _WIN32
	HANDLE h = CreateFileA(path.c_str(), GENERIC_WRITE, FILE_SHARE_WRITE | FILE_SHARE_READ,
	                       nullptr, CREATE_ALWAYS, FILE_ATTRIBUTE_NORMAL,
	                       INVALID_HANDLE_VALUE);
	if (h == INVALID_HANDLE_VALUE)
		return false;

	SYSTEMTIME st;
	FILETIME ft;
	GetSystemTime(&st);
	SystemTimeToFileTime(&st, &ft);
	bool success = SetFileTime(h, nullptr, nullptr, &ft) != 0;
	CloseHandle(h);
	return success;
#else
	int fd = ::open(path.c_str(), O_WRONLY | O_CREAT | O_TRUNC, 0640);
	if (fd < 0)
		return false;

	const struct timespec times[2] = {{ 0, UTIME_NOW }, { 0, UTIME_NOW }};
	bool ret = ::futimens(fd, times) == 0;
	::close(fd);
	return ret;
#endif
}